

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O0

ir_visitor_status __thiscall
anon_unknown.dwarf_623c5::lower_ubo_reference_visitor::visit_enter
          (lower_ubo_reference_visitor *this,ir_call *ir)

{
  ir_call *piVar1;
  exec_node *local_38;
  ir_call *new_ir;
  ir_call *ir_local;
  lower_ubo_reference_visitor *this_local;
  
  piVar1 = check_for_ssbo_atomic_intrinsic(this,ir);
  if (piVar1 == ir) {
    this_local._4_4_ = ir_rvalue_base_visitor::rvalue_visit((ir_rvalue_base_visitor *)this,ir);
  }
  else {
    this->progress = true;
    local_38 = (exec_node *)0x0;
    if (piVar1 != (ir_call *)0x0) {
      local_38 = &(piVar1->super_ir_instruction).super_exec_node;
    }
    exec_node::replace_with
              (&((this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
                 super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir)->
                super_exec_node,local_38);
    this_local._4_4_ = visit_continue_with_parent;
  }
  return this_local._4_4_;
}

Assistant:

ir_visitor_status
lower_ubo_reference_visitor::visit_enter(ir_call *ir)
{
   ir_call *new_ir = check_for_ssbo_atomic_intrinsic(ir);
   if (new_ir != ir) {
      progress = true;
      base_ir->replace_with(new_ir);
      return visit_continue_with_parent;
   }

   return rvalue_visit(ir);
}